

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bool_data.cpp
# Opt level: O2

void duckdb::ArrowBoolData::Append
               (ArrowAppendData *append_data,Vector *input,idx_t from,idx_t to,idx_t input_size)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  ArrowBuffer *buffer;
  ArrowBuffer *buffer_00;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t i;
  bool bVar7;
  UnifiedVectorFormat format;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&format);
  Vector::ToUnifiedFormat(input,input_size,&format);
  buffer = ArrowAppendData::GetMainBuffer(append_data);
  buffer_00 = ArrowAppendData::GetValidityBuffer(append_data);
  lVar4 = to - from;
  ResizeValidity(buffer_00,append_data->row_count + lVar4);
  ResizeValidity(buffer,append_data->row_count + lVar4);
  pdVar1 = buffer->dataptr;
  pdVar2 = buffer_00->dataptr;
  uVar5 = append_data->row_count >> 3;
  bVar3 = (byte)append_data->row_count & 7;
  for (; from < to; from = from + 1) {
    uVar6 = from;
    if ((format.sel)->sel_vector != (sel_t *)0x0) {
      uVar6 = (ulong)(format.sel)->sel_vector[from];
    }
    if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar6 >> 6] >>
         (uVar6 & 0x3f) & 1) != 0)) {
      if (format.data[uVar6] == '\0') {
        pdVar1[uVar5] = pdVar1[uVar5] & ~(byte)(1L << (bVar3 & 0x3f));
      }
    }
    else {
      pdVar2[uVar5] = pdVar2[uVar5] & ~(byte)(1L << (bVar3 & 0x3f));
      append_data->null_count = append_data->null_count + 1;
    }
    bVar3 = bVar3 + 1;
    bVar7 = bVar3 == 8;
    if (bVar7) {
      bVar3 = 0;
    }
    uVar5 = uVar5 + bVar7;
  }
  append_data->row_count = append_data->row_count + lVar4;
  UnifiedVectorFormat::~UnifiedVectorFormat(&format);
  return;
}

Assistant:

void ArrowBoolData::Append(ArrowAppendData &append_data, Vector &input, idx_t from, idx_t to, idx_t input_size) {
	idx_t size = to - from;
	UnifiedVectorFormat format;
	input.ToUnifiedFormat(input_size, format);
	auto &main_buffer = append_data.GetMainBuffer();
	auto &validity_buffer = append_data.GetValidityBuffer();
	// we initialize both the validity and the bit set to 1's
	ResizeValidity(validity_buffer, append_data.row_count + size);
	ResizeValidity(main_buffer, append_data.row_count + size);
	auto data = UnifiedVectorFormat::GetData<bool>(format);

	auto result_data = main_buffer.GetData<uint8_t>();
	auto validity_data = validity_buffer.GetData<uint8_t>();
	uint8_t current_bit;
	idx_t current_byte;
	GetBitPosition(append_data.row_count, current_byte, current_bit);
	for (idx_t i = from; i < to; i++) {
		auto source_idx = format.sel->get_index(i);
		// append the validity mask
		if (!format.validity.RowIsValid(source_idx)) {
			SetNull(append_data, validity_data, current_byte, current_bit);
		} else if (!data[source_idx]) {
			UnsetBit(result_data, current_byte, current_bit);
		}
		NextBit(current_byte, current_bit);
	}
	append_data.row_count += size;
}